

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.cpp
# Opt level: O3

void * MS5837Thread(void *pParam)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  double dVar9;
  ulong uVar10;
  double dVar11;
  char *pcVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  float temperature;
  CHRONO chrono_filter;
  CHRONO chrono_period;
  char szTemp [256];
  char szSaveFilePath [256];
  interval local_a50;
  int local_a38;
  int local_a34;
  timespec local_a30;
  double local_a20;
  double dStack_a18;
  double local_a10;
  double dStack_a08;
  timespec local_a00;
  int local_9f0;
  undefined1 local_9e8 [16];
  timespec local_9d0;
  double local_9c0;
  double dStack_9b8;
  double local_9b0;
  double dStack_9a8;
  timespec local_9a0;
  int local_990;
  undefined1 local_988 [16];
  double local_970;
  double local_968;
  interval local_960;
  double local_948;
  double dStack_940;
  interval local_938;
  undefined1 local_920 [1160];
  double local_498;
  double dStack_490;
  double local_488;
  char local_480 [528];
  int local_270;
  int local_26c;
  double local_248;
  undefined8 local_240;
  char local_238 [256];
  char local_138 [264];
  
  memset(local_920,0,0x6e8);
  iVar5 = clock_getres(4,&local_a00);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_a30), iVar5 == 0)) {
    local_9f0 = 0;
    local_a20 = 0.0;
    dStack_a18 = 0.0;
    local_a10 = 0.0;
    dStack_a08 = 0.0;
  }
  iVar5 = clock_getres(4,&local_9a0);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_9d0), iVar5 == 0)) {
    local_990 = 0;
    local_9c0 = 0.0;
    dStack_9b8 = 0.0;
    local_9b0 = 0.0;
    dStack_9a8 = 0.0;
  }
  iVar5 = 0x32;
  local_988 = ZEXT816(0);
  bVar2 = false;
  local_a34 = 0;
  do {
    iVar7 = iVar5 / 1000;
    iVar6 = iVar5 % 1000;
    bVar2 = !bVar2;
    local_a38 = iVar5;
    while( true ) {
      if (local_990 == 0) {
        clock_gettime(4,(timespec *)&local_a50);
        local_9c0 = local_a50.inf;
        dStack_9b8 = local_a50.sup;
        local_a50.inf =
             (double)((((long)local_a50.inf + (long)local_9b0) - local_9d0.tv_sec) +
                     ((long)local_a50.sup + (long)dStack_9a8) / 1000000000);
        local_a50.sup =
             (double)(((long)local_a50.sup + (long)dStack_9a8) % 1000000000 - local_9d0.tv_nsec);
        if ((long)local_a50.sup < 0) {
          local_a50.inf =
               (double)((long)local_a50.inf + ~((ulong)-(long)local_a50.sup / 1000000000));
          local_a50.sup =
               (double)((long)local_a50.sup + 1000000000 +
                       ((ulong)-(long)local_a50.sup / 1000000000) * 1000000000);
        }
        local_9b0 = local_a50.inf;
        dStack_9a8 = local_a50.sup;
      }
      iVar5 = clock_getres(4,&local_9a0);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_9d0), iVar5 == 0)) {
        local_990 = 0;
        local_9b0 = 0.0;
        dStack_9a8 = 0.0;
        local_9c0 = 0.0;
        dStack_9b8 = 0.0;
      }
      local_a50.inf = (double)(long)iVar7;
      local_a50.sup = (double)(long)(iVar6 * 1000000);
      nanosleep((timespec *)&local_a50,(timespec *)0x0);
      iVar5 = local_a38;
      if (bPauseMS5837 == 0) break;
      if (!bVar2) {
        puts("MS5837 paused.");
        uVar14 = local_920._16_4_;
        iVar5 = local_920._0_4_;
        if (local_920._1080_4_ == 0) {
LAB_001bd6be:
          iVar5 = close(iVar5);
          pcVar12 = "MS5837 disconnected.";
          if (iVar5 != 0) {
switchD_001bd67d_default:
            pcVar12 = "MS5837 disconnection failed.";
          }
        }
        else {
          pcVar12 = "MS5837 disconnection failed.";
          if (local_920._1080_4_ == 1) {
            switch(local_920._792_4_) {
            case 0:
              iVar5 = local_920._8_4_;
              goto LAB_001bd6be;
            case 1:
            case 3:
              iVar5 = local_920._16_4_;
              break;
            case 2:
              shutdown(local_920._16_4_,2);
              close(uVar14);
            case 4:
              iVar5 = local_920._20_4_;
              break;
            default:
              goto switchD_001bd67d_default;
            }
            shutdown(iVar5,2);
            goto LAB_001bd6be;
          }
        }
        puts(pcVar12);
      }
      if (bExit != 0) goto LAB_001bdf86;
      local_a50.inf = 0.0;
      local_a50.sup = 4.94065645841247e-316;
      nanosleep((timespec *)&local_a50,(timespec *)0x0);
      bVar2 = true;
    }
    if (bRestartMS5837 == 0) {
      if (bVar2) goto LAB_001bd9fa;
      local_a50.inf = (double)((ulong)local_a50.inf & 0xffffffff00000000);
      local_960.inf._0_4_ = 0.0;
      iVar7 = ms5837_read_temperature_and_pressure
                        ((MS5837 *)local_920,(float *)&local_a50,(float *)&local_960);
      if (iVar7 == 0) {
        uVar14 = SUB84((double)local_a50.inf._0_4_,0);
        uVar15 = (undefined4)((ulong)(double)local_a50.inf._0_4_ >> 0x20);
        local_920._1152_4_ = uVar14;
        local_920._1144_8_ = (double)local_960.inf._0_4_;
        local_920._1156_4_ = uVar15;
        local_488 = (double)local_960.inf._0_4_ / 1000.0;
        local_9e8._8_4_ = uVar14;
        local_9e8._0_8_ = local_488;
        local_9e8._12_4_ = uVar15;
        local_498 = local_948;
        dStack_490 = dStack_940;
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        pressure_mes = local_9e8._0_8_;
        dVar11 = local_a10;
        dVar9 = dStack_a08;
        if (local_9f0 == 0) {
          clock_gettime(4,(timespec *)&local_a50);
          dVar11 = (double)((((long)local_a50.inf + (long)local_a10) - local_a30.tv_sec) +
                           ((long)local_a50.sup + (long)dStack_a08) / 1000000000);
          dVar9 = (double)(((long)local_a50.sup + (long)dStack_a08) % 1000000000 - local_a30.tv_nsec
                          );
          if ((long)dVar9 < 0) {
            dVar11 = (double)((long)dVar11 + ~((ulong)-(long)dVar9 / 1000000000));
            dVar9 = (double)((long)dVar9 + 1000000000 +
                            ((ulong)-(long)dVar9 / 1000000000) * 1000000000);
          }
        }
        if (2.0 < (double)(long)dVar9 / 1000000000.0 + (double)(long)dVar11) {
          dVar11 = local_a10;
          dVar9 = dStack_a08;
          if (local_9f0 == 0) {
            clock_gettime(4,(timespec *)&local_a50);
            dVar11 = (double)((((long)local_a50.inf + (long)local_a10) - local_a30.tv_sec) +
                             ((long)local_a50.sup + (long)dStack_a08) / 1000000000);
            dVar9 = (double)(((long)local_a50.sup + (long)dStack_a08) % 1000000000 -
                            local_a30.tv_nsec);
            if ((long)dVar9 < 0) {
              dVar11 = (double)((long)dVar11 + ~((ulong)-(long)dVar9 / 1000000000));
              dVar9 = (double)((long)dVar9 + 1000000000 +
                              ((ulong)-(long)dVar9 / 1000000000) * 1000000000);
            }
          }
          if ((double)(long)dVar9 / 1000000000.0 + (double)(long)dVar11 <= 3.0) {
            local_988 = local_9e8;
          }
        }
        dVar11 = local_a10;
        dVar9 = dStack_a08;
        if (local_9f0 == 0) {
          clock_gettime(4,(timespec *)&local_a50);
          dVar11 = (double)((((long)local_a50.inf + (long)local_a10) - local_a30.tv_sec) +
                           ((long)local_a50.sup + (long)dStack_a08) / 1000000000);
          dVar9 = (double)(((long)local_a50.sup + (long)dStack_a08) % 1000000000 - local_a30.tv_nsec
                          );
          if ((long)dVar9 < 0) {
            dVar11 = (double)((long)dVar11 + ~((ulong)-(long)dVar9 / 1000000000));
            dVar9 = (double)((long)dVar9 + 1000000000 +
                            ((ulong)-(long)dVar9 / 1000000000) * 1000000000);
          }
        }
        dVar16 = local_9e8._0_8_;
        if (3.0 < (double)(long)dVar9 / 1000000000.0 + (double)(long)dVar11) {
          uVar10 = local_9e8._8_8_ & 0x7fffffffffffffff;
          uVar13 = -(ulong)(ABS(dVar16 - (double)local_988._0_8_) < 0.05);
          auVar17._0_8_ = (ulong)dVar16 & uVar13;
          auVar17._8_8_ = local_9e8._8_8_ & uVar10;
          uVar10 = ~uVar10 & local_988._8_8_;
          auVar1._8_4_ = (int)uVar10;
          auVar1._0_8_ = ~uVar13 & local_988._0_8_;
          auVar1._12_4_ = (int)(uVar10 >> 0x20);
          local_988 = auVar17 | auVar1;
          dVar16 = local_988._0_8_;
        }
        local_968 = ((dVar16 - local_248) * -100000.0) / (local_240 * 9.80665);
        interval::interval(&local_960,&local_968);
        local_970 = -z_pressure_acc;
        interval::interval(&local_938,&local_970,&z_pressure_acc);
        operator+(&local_960,&local_938);
        interval::operator=((interval *)&z_pressure,&local_a50);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_001bdf17;
      }
      puts("Connection to a MS5837 lost.");
      uVar14 = local_920._16_4_;
      iVar7 = local_a34;
      iVar5 = local_920._0_4_;
      if (local_920._1080_4_ == 0) {
LAB_001bdf53:
        iVar5 = close(iVar5);
        pcVar12 = "MS5837 disconnected.";
        if (iVar5 != 0) {
switchD_001bd816_default:
          pcVar12 = "MS5837 disconnection failed.";
        }
      }
      else {
        pcVar12 = "MS5837 disconnection failed.";
        if (local_920._1080_4_ == 1) {
          switch(local_920._792_4_) {
          case 0:
            iVar5 = local_920._8_4_;
            goto LAB_001bdf53;
          case 1:
          case 3:
            iVar5 = local_920._16_4_;
            break;
          case 2:
            shutdown(local_920._16_4_,2);
            close(uVar14);
          case 4:
            iVar5 = local_920._20_4_;
            break;
          default:
            goto switchD_001bd816_default;
          }
          shutdown(iVar5,2);
          goto LAB_001bdf53;
        }
      }
      puts(pcVar12);
LAB_001bda32:
      if (ExitOnErrorCount <= iVar7 + 1 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_001bdf86:
        bVar3 = true;
        break;
      }
      bVar2 = false;
      bVar3 = true;
      iVar5 = local_a38;
      local_a34 = iVar7 + 1;
    }
    else {
      if (!bVar2) {
        puts("Restarting a MS5837.");
        uVar14 = local_920._16_4_;
        iVar5 = local_920._0_4_;
        if (local_920._1080_4_ == 0) {
LAB_001bd9cf:
          iVar5 = close(iVar5);
          pcVar12 = "MS5837 disconnected.";
          if (iVar5 != 0) {
switchD_001bd77b_default:
            pcVar12 = "MS5837 disconnection failed.";
          }
        }
        else {
          pcVar12 = "MS5837 disconnection failed.";
          if (local_920._1080_4_ == 1) {
            switch(local_920._792_4_) {
            case 0:
              iVar5 = local_920._8_4_;
              goto LAB_001bd9cf;
            case 1:
            case 3:
              iVar5 = local_920._16_4_;
              break;
            case 2:
              shutdown(local_920._16_4_,2);
              close(uVar14);
            case 4:
              iVar5 = local_920._20_4_;
              break;
            default:
              goto switchD_001bd77b_default;
            }
            shutdown(iVar5,2);
            goto LAB_001bd9cf;
          }
        }
        puts(pcVar12);
      }
      bRestartMS5837 = 0;
LAB_001bd9fa:
      iVar7 = ConnectMS5837((MS5837 *)local_920,"MS58370.txt");
      iVar5 = local_270;
      if (iVar7 != 0) {
        local_a50.inf = 4.94065645841247e-324;
        local_a50.sup = 0.0;
        nanosleep((timespec *)&local_a50,(timespec *)0x0);
        iVar7 = local_a34;
        goto LAB_001bda32;
      }
      local_948 = 0.0;
      dStack_940 = 0.0;
      if (local_9f0 == 0) {
        clock_gettime(4,(timespec *)&local_a50);
        local_a20 = local_a50.inf;
        dStack_a18 = local_a50.sup;
        local_a50.inf =
             (double)((((long)local_a50.inf + (long)local_a10) - local_a30.tv_sec) +
                     ((long)local_a50.sup + (long)dStack_a08) / 1000000000);
        local_a50.sup =
             (double)(((long)local_a50.sup + (long)dStack_a08) % 1000000000 - local_a30.tv_nsec);
        if ((long)local_a50.sup < 0) {
          local_a50.inf =
               (double)((long)local_a50.inf + ~((ulong)-(long)local_a50.sup / 1000000000));
          local_a50.sup =
               (double)((long)local_a50.sup + 1000000000 +
                       ((ulong)-(long)local_a50.sup / 1000000000) * 1000000000);
        }
        local_a10 = local_a50.inf;
        dStack_a08 = local_a50.sup;
      }
      iVar7 = clock_getres(4,&local_a00);
      if ((iVar7 == 0) && (iVar7 = clock_gettime(4,&local_a30), iVar7 == 0)) {
        local_9f0 = 0;
        local_a10 = 0.0;
        dStack_a08 = 0.0;
        local_a20 = 0.0;
        dStack_a18 = 0.0;
      }
      if ((FILE *)local_920._1136_8_ != (FILE *)0x0) {
        fclose((FILE *)local_920._1136_8_);
        local_920._1136_8_ = (FILE *)0x0;
      }
      bVar2 = true;
      if (local_26c == 0) {
LAB_001bdf17:
        bVar2 = true;
        bVar3 = false;
      }
      else {
        if (local_480[0] == '\0') {
          builtin_strncpy(local_238,"ms5837",7);
        }
        else {
          sprintf(local_238,"%.127s",local_480);
        }
        sVar8 = strlen(local_238);
        iVar7 = (int)sVar8 + 1;
        uVar10 = sVar8 & 0xffffffff;
        do {
          if ((int)uVar10 < 1) goto LAB_001bdc2c;
          uVar13 = uVar10 - 1;
          iVar7 = iVar7 + -1;
          lVar4 = uVar10 + 7;
          uVar10 = uVar13;
        } while (*(char *)((long)&local_240 + lVar4) != '.');
        if ((uVar13 != 0) && (iVar7 <= (int)sVar8)) {
          memset(local_238 + (uVar13 & 0xffffffff),0,sVar8 - (uVar13 & 0xffffffff));
        }
LAB_001bdc2c:
        local_a38 = iVar5;
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar12 = strtimeex_fns();
        bVar3 = false;
        sprintf(local_138,"log/%.127s_%.64s.txt",local_238,pcVar12);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        iVar5 = local_a38;
        local_920._1136_8_ = fopen(local_138,"w");
        if ((FILE *)local_920._1136_8_ == (FILE *)0x0) {
          puts("Unable to create MS5837 data file.");
          bVar3 = false;
          break;
        }
      }
    }
  } while (bExit == 0);
  if (local_990 == 0) {
    clock_gettime(4,(timespec *)&local_a50);
    local_9c0 = local_a50.inf;
    dStack_9b8 = local_a50.sup;
    local_a50.inf =
         (double)((((long)local_a50.inf + (long)local_9b0) - local_9d0.tv_sec) +
                 ((long)local_a50.sup + (long)dStack_9a8) / 1000000000);
    local_a50.sup =
         (double)(((long)local_a50.sup + (long)dStack_9a8) % 1000000000 - local_9d0.tv_nsec);
    if ((long)local_a50.sup < 0) {
      local_a50.inf = (double)((long)local_a50.inf + ~((ulong)-(long)local_a50.sup / 1000000000));
      local_a50.sup =
           (double)((long)local_a50.sup + 1000000000 +
                   ((ulong)-(long)local_a50.sup / 1000000000) * 1000000000);
    }
    local_9b0 = local_a50.inf;
    dStack_9a8 = local_a50.sup;
  }
  if (local_9f0 == 0) {
    clock_gettime(4,(timespec *)&local_a50);
    local_a20 = local_a50.inf;
    dStack_a18 = local_a50.sup;
    local_a50.inf =
         (double)((((long)local_a50.inf + (long)local_a10) - local_a30.tv_sec) +
                 ((long)local_a50.sup + (long)dStack_a08) / 1000000000);
    local_a50.sup =
         (double)(((long)local_a50.sup + (long)dStack_a08) % 1000000000 - local_a30.tv_nsec);
    if ((long)local_a50.sup < 0) {
      local_a50.inf = (double)((long)local_a50.inf + ~((ulong)-(long)local_a50.sup / 1000000000));
      local_a50.sup =
           (double)((long)local_a50.sup + 1000000000 +
                   ((ulong)-(long)local_a50.sup / 1000000000) * 1000000000);
    }
    local_a10 = local_a50.inf;
    dStack_a08 = local_a50.sup;
  }
  if ((FILE *)local_920._1136_8_ != (FILE *)0x0) {
    fclose((FILE *)local_920._1136_8_);
    local_920._1136_8_ = (FILE *)0x0;
  }
  if (bVar3) goto LAB_001be1d2;
  pcVar12 = "MS5837 disconnection failed.";
  if (local_920._1080_4_ == 0) {
LAB_001be1b8:
    iVar5 = close(local_920._0_4_);
    if (iVar5 == 0) {
      pcVar12 = "MS5837 disconnected.";
    }
  }
  else if (local_920._1080_4_ == 1) {
    switch(local_920._792_4_) {
    case 0:
      local_920._0_4_ = local_920._8_4_;
      goto LAB_001be1b8;
    case 1:
    case 3:
      iVar5 = local_920._16_4_;
      break;
    case 2:
      shutdown(local_920._16_4_,2);
      close(local_920._16_4_);
    case 4:
      iVar5 = local_920._20_4_;
      break;
    default:
      goto switchD_001be177_default;
    }
    shutdown(iVar5,2);
    local_920._0_4_ = iVar5;
    goto LAB_001be1b8;
  }
switchD_001be177_default:
  puts(pcVar12);
LAB_001be1d2:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE MS5837Thread(void* pParam)
{
	MS5837 ms5837;
	MS5837DATA ms5837data;
	double pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ms5837, 0, sizeof(MS5837));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMS5837) 
		{ 
			if (bConnected)
			{
				printf("MS5837 paused.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMS5837) 
		{ 
			if (bConnected)
			{
				printf("Restarting a MS5837.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
			bRestartMS5837 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMS5837(&ms5837, "MS58370.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ms5837.threadperiod;

				memset(&ms5837data, 0, sizeof(ms5837data));
				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (ms5837.pfSaveFile != NULL)
				{
					fclose(ms5837.pfSaveFile); 
					ms5837.pfSaveFile = NULL;
				}
				if ((ms5837.bSaveRawData)&&(ms5837.pfSaveFile == NULL)) 
				{
					if (strlen(ms5837.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ms5837.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ms5837");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ms5837.pfSaveFile = fopen(szSaveFilePath, "w");
					if (ms5837.pfSaveFile == NULL) 
					{
						printf("Unable to create MS5837 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataMS5837(&ms5837, &ms5837data) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = ms5837data.Pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = ms5837data.Pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(ms5837data.Pressure-pressure_prev) < 0.05)
					{
						filteredpressure = ms5837data.Pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = ms5837data.Pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, ms5837.PressureRef, ms5837.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a MS5837 lost.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
		}

		//printf("MS5837Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (ms5837.pfSaveFile != NULL)
	{
		fclose(ms5837.pfSaveFile); 
		ms5837.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMS5837(&ms5837);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}